

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::SIMDFastPFor<4U>::__encodeArray
          (SIMDFastPFor<4U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  undefined4 *puVar2;
  pointer pvVar3;
  long lVar4;
  iterator __position;
  bool bVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  SIMDFastPFor<4U> *pSVar8;
  __m128i *palVar9;
  uint32_t *puVar10;
  long lVar11;
  ulong uVar12;
  uint32_t bit;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *this_00;
  byte *__src;
  uint32_t k;
  uint uVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar19 [32];
  undefined1 auVar17 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  undefined1 auVar39 [64];
  undefined1 in_ZMM6 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  uint8_t bestb;
  uint8_t maxb;
  uint8_t bestcexcept;
  byte local_63;
  byte local_62;
  byte local_61;
  SIMDFastPFor<4U> *local_60;
  __m128i *local_58;
  uint local_4c;
  uint32_t *local_48;
  size_t *local_40;
  uint32_t *local_38;
  undefined1 auVar21 [32];
  undefined1 auVar18 [32];
  undefined1 auVar20 [32];
  undefined1 auVar28 [64];
  
  checkifdivisibleby(length,0x80);
  auVar20 = in_ZMM6._0_32_;
  pvVar3 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = 8;
  do {
    lVar4 = *(long *)((long)pvVar3 + lVar11 + -8);
    if (*(long *)((long)&(pvVar3->
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         )._M_impl.super__Vector_impl_data + lVar11) != lVar4) {
      *(long *)((long)&(pvVar3->
                       super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                       )._M_impl.super__Vector_impl_data + lVar11) = lVar4;
    }
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 800);
  __src = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start;
  local_58 = (__m128i *)(out + 1);
  pbVar14 = __src;
  local_60 = this;
  if (0x7f < (long)length) {
    local_38 = in + length;
    puVar10 = in + 0x80;
    local_48 = out;
    local_40 = nvalue;
    do {
      pSVar8 = local_60;
      getBestBFromData(local_60,in,&local_63,&local_61,&local_62);
      bVar7 = local_63;
      *pbVar14 = local_63;
      pbVar14[1] = local_61;
      if (local_61 == 0) {
        pbVar14 = pbVar14 + 2;
      }
      else {
        pbVar14[2] = local_62;
        pbVar14 = pbVar14 + 3;
        this_00 = (pSVar8->datatobepacked).
                  super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + ((ulong)local_62 - (ulong)local_63);
        lVar11 = 0;
        do {
          if (in[lVar11] >> (bVar7 & 0x1f) != 0) {
            local_4c = in[lVar11] >> (local_63 & 0x1f);
            __position._M_current =
                 (this_00->
                 super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this_00->
                super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::
              _M_realloc_insert<unsigned_int>(this_00,__position,&local_4c);
            }
            else {
              *__position._M_current = local_4c;
              (this_00->
              super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
              )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            *pbVar14 = (byte)lVar11;
            pbVar14 = pbVar14 + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x80);
      }
      palVar9 = local_58;
      bVar7 = local_63;
      SIMD_fastpack_32(in,local_58,(uint)local_63);
      auVar20 = in_ZMM6._0_32_;
      local_58 = palVar9 + bVar7;
      puVar10 = puVar10 + 0x80;
      in = in + 0x80;
    } while (puVar10 <= local_38);
    __src = (local_60->bytescontainer).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    out = local_48;
    nvalue = local_40;
  }
  palVar9 = local_58;
  uVar13 = (int)pbVar14 - (int)__src;
  puVar10 = (uint32_t *)((long)*local_58 + 4);
  *out = (uint32_t)((ulong)((long)local_58 - (long)out) >> 2);
  *(uint *)*local_58 = uVar13;
  uVar15 = (ulong)uVar13;
  memcpy(puVar10,__src,uVar15);
  uVar16 = uVar15 + 3 & 0xfffffffffffffffc;
  if (uVar15 < uVar16) {
    uVar1 = (long)*palVar9 + uVar15 + 5;
    uVar12 = (long)*palVar9 + uVar16 + 4;
    if (uVar12 < uVar1) {
      uVar12 = uVar1;
    }
    memset((void *)((long)puVar10 + uVar15),0,(uVar12 - ((long)*palVar9 + uVar15)) - 4);
  }
  pSVar8 = local_60;
  puVar2 = (undefined4 *)((long)*palVar9 + uVar16 + 4);
  auVar21 = vpmovsxbd_avx2(ZEXT816(0x908070605040302));
  auVar22 = vpmovsxbq_avx512f(ZEXT816(0x908070605040302));
  auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar24 = vpbroadcastq_avx512f(ZEXT816(0x1f));
  auVar25 = vpbroadcastq_avx512f(ZEXT816(0x18));
  auVar40._8_4_ = 1;
  auVar40._0_8_ = 0x100000001;
  auVar40._12_4_ = 1;
  auVar40._16_4_ = 1;
  auVar40._20_4_ = 1;
  auVar40._24_4_ = 1;
  auVar40._28_4_ = 1;
  auVar26 = vpbroadcastq_avx512f(ZEXT816(8));
  auVar41._8_4_ = 8;
  auVar41._0_8_ = 0x800000008;
  auVar41._12_4_ = 8;
  auVar41._16_4_ = 8;
  auVar41._20_4_ = 8;
  auVar41._24_4_ = 8;
  auVar41._28_4_ = 8;
  auVar39 = ZEXT1664((undefined1  [16])0x0);
  auVar20 = vpcmpeqd_avx2(auVar20,auVar20);
  lVar11 = 0;
  pvVar3 = (local_60->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    auVar27 = vpbroadcastq_avx512f();
    vpmullq_avx512dq(auVar22,auVar25);
    lVar11 = lVar11 + 8;
    auVar22 = vpaddq_avx512f(auVar22,auVar26);
    auVar27 = vporq_avx512f(auVar27,auVar23);
    uVar15 = vpcmpuq_avx512f(auVar27,auVar24,1);
    auVar28 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)&(pvVar3->
                                          super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                          )._M_impl.super__Vector_impl_data + (long)nvalue));
    auVar29._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar28._8_8_;
    auVar29._0_8_ = (ulong)((byte)uVar15 & 1) * auVar28._0_8_;
    auVar29._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * auVar28._16_8_;
    auVar29._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar28._24_8_;
    auVar29._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * auVar28._32_8_;
    auVar29._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * auVar28._40_8_;
    auVar29._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * auVar28._48_8_;
    auVar29._56_8_ = (uVar15 >> 7) * auVar28._56_8_;
    auVar28 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)((long)&(pvVar3->
                                                 super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                                 )._M_impl.super__Vector_impl_data + 8U) +
                                  (long)nvalue));
    auVar30._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar28._8_8_;
    auVar30._0_8_ = (ulong)((byte)uVar15 & 1) * auVar28._0_8_;
    auVar30._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * auVar28._16_8_;
    auVar30._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar28._24_8_;
    auVar30._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * auVar28._32_8_;
    auVar30._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * auVar28._40_8_;
    auVar30._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * auVar28._48_8_;
    auVar30._56_8_ = (uVar15 >> 7) * auVar28._56_8_;
    auVar18 = vpaddd_avx2(auVar21,auVar20);
    auVar21 = vpaddd_avx2(auVar41,auVar21);
    auVar18 = vpsllvd_avx2(auVar40,auVar18);
    uVar15 = vpcmpq_avx512f(auVar30,auVar29,4);
    auVar18 = vpord_avx512vl(auVar39._0_32_,auVar18);
    bVar5 = (bool)((byte)uVar15 & 1);
    iVar31 = auVar39._0_4_;
    auVar19._0_4_ = (uint)bVar5 * auVar18._0_4_ | (uint)!bVar5 * iVar31;
    bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
    iVar32 = auVar39._4_4_;
    auVar19._4_4_ = (uint)bVar5 * auVar18._4_4_ | (uint)!bVar5 * iVar32;
    bVar5 = (bool)((byte)(uVar15 >> 2) & 1);
    iVar33 = auVar39._8_4_;
    auVar19._8_4_ = (uint)bVar5 * auVar18._8_4_ | (uint)!bVar5 * iVar33;
    bVar5 = (bool)((byte)(uVar15 >> 3) & 1);
    iVar34 = auVar39._12_4_;
    auVar19._12_4_ = (uint)bVar5 * auVar18._12_4_ | (uint)!bVar5 * iVar34;
    bVar5 = (bool)((byte)(uVar15 >> 4) & 1);
    iVar35 = auVar39._16_4_;
    auVar19._16_4_ = (uint)bVar5 * auVar18._16_4_ | (uint)!bVar5 * iVar35;
    bVar5 = (bool)((byte)(uVar15 >> 5) & 1);
    iVar36 = auVar39._20_4_;
    auVar19._20_4_ = (uint)bVar5 * auVar18._20_4_ | (uint)!bVar5 * iVar36;
    bVar5 = (bool)((byte)(uVar15 >> 6) & 1);
    iVar37 = auVar39._24_4_;
    auVar19._24_4_ = (uint)bVar5 * auVar18._24_4_ | (uint)!bVar5 * iVar37;
    bVar5 = SUB81(uVar15 >> 7,0);
    iVar38 = auVar39._28_4_;
    auVar19._28_4_ = (uint)bVar5 * auVar18._28_4_ | (uint)!bVar5 * iVar38;
    auVar39 = ZEXT3264(auVar19);
  } while (lVar11 != 0x20);
  auVar22._8_8_ = 0x1f;
  auVar22._0_8_ = 0x1f;
  auVar22._16_8_ = 0x1f;
  auVar22._24_8_ = 0x1f;
  auVar22._32_8_ = 0x1f;
  auVar22._40_8_ = 0x1f;
  auVar22._48_8_ = 0x1f;
  auVar22._56_8_ = 0x1f;
  uVar15 = vpcmpuq_avx512f(auVar27,auVar22,1);
  bit = 2;
  lVar11 = 0;
  auVar20 = vmovdqa32_avx512vl(auVar19);
  bVar5 = (bool)((byte)uVar15 & 1);
  auVar17._0_4_ = (uint)bVar5 * auVar20._0_4_ | (uint)!bVar5 * iVar31;
  bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
  auVar17._4_4_ = (uint)bVar5 * auVar20._4_4_ | (uint)!bVar5 * iVar32;
  bVar5 = (bool)((byte)(uVar15 >> 2) & 1);
  auVar17._8_4_ = (uint)bVar5 * auVar20._8_4_ | (uint)!bVar5 * iVar33;
  bVar5 = (bool)((byte)(uVar15 >> 3) & 1);
  auVar17._12_4_ = (uint)bVar5 * auVar20._12_4_ | (uint)!bVar5 * iVar34;
  bVar5 = (bool)((byte)(uVar15 >> 4) & 1);
  auVar21._16_4_ = (uint)bVar5 * auVar20._16_4_ | (uint)!bVar5 * iVar35;
  auVar21._0_16_ = auVar17;
  bVar5 = (bool)((byte)(uVar15 >> 5) & 1);
  auVar21._20_4_ = (uint)bVar5 * auVar20._20_4_ | (uint)!bVar5 * iVar36;
  bVar5 = (bool)((byte)(uVar15 >> 6) & 1);
  auVar21._24_4_ = (uint)bVar5 * auVar20._24_4_ | (uint)!bVar5 * iVar37;
  bVar5 = SUB81(uVar15 >> 7,0);
  auVar21._28_4_ = (uint)bVar5 * auVar20._28_4_ | (uint)!bVar5 * iVar38;
  auVar17 = vpor_avx(auVar17,auVar21._16_16_);
  auVar6 = vpshufd_avx(auVar17,0xee);
  auVar17 = vpor_avx(auVar17,auVar6);
  auVar6 = vpshufd_avx(auVar17,0x55);
  auVar17 = vpor_avx(auVar17,auVar6);
  *puVar2 = auVar17._0_4_;
  puVar10 = puVar2 + 1;
  do {
    pvVar3 = (pSVar8->datatobepacked).
             super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(long *)((long)&pvVar3[2].
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         ._M_impl.super__Vector_impl_data + lVar11 + 8) !=
        *(long *)((long)&pvVar3[2].
                         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                         ._M_impl.super__Vector_impl_data + lVar11)) {
      puVar10 = SIMDFastPFor<4u>::
                packmeupwithoutmasksimd<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                          ((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                            *)((long)&pvVar3[2].
                                      super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                      ._M_impl.super__Vector_impl_data + lVar11),puVar10,bit);
    }
    bit = bit + 1;
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x2e8);
  *nvalue = (long)puVar10 - (long)out >> 2;
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out; // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++; // keep track of this
    for (uint32_t k = 0; k < 32 + 1; ++k)
      datatobepacked[k].clear();
    uint8_t *bc = &bytescontainer[0];
    for (const uint32_t *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        *bc++ = maxb;
        std::vector<uint32_t, cacheallocator> &thisexceptioncontainer =
            datatobepacked[maxb - bestb];
        const uint32_t maxval = 1U << bestb;
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            // we have an exception
            thisexceptioncontainer.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockupsimd(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    uint32_t bitmap = 0;
    for (uint32_t k = 2; k <= 32; ++k) {
      if (datatobepacked[k].size() != 0)
        bitmap |= (1U << (k - 1));
    }
    *(out++) = bitmap;
    for (uint32_t k = 2; k <= 32; ++k) {
      if (datatobepacked[k].size() > 0)
        out = packmeupwithoutmasksimd(datatobepacked[k], out, k);
    }
    nvalue = out - initout;
  }